

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandPrintStatus(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *p;
  bool bVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  Extra_UtilGetoptReset();
  bVar1 = true;
  while (iVar2 = Extra_UtilGetopt(argc,argv,"sh"), iVar2 == 0x73) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 != -1) {
    Abc_Print(-2,"usage: print_status [-sh]\n");
    Abc_Print(-2,"\t        prints verification status\n");
    pcVar6 = "yes";
    if (!bVar1) {
      pcVar6 = "no";
    }
    Abc_Print(-2,"\t-s    : toggle using short print-out [default = %s]\n",pcVar6);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    return 1;
  }
  Abc_Print(1,"Status = %d  Frames = %d   ",(ulong)(uint)pAbc->Status,(ulong)(uint)pAbc->nFrames);
  if (pAbc->pCex == (Abc_Cex_t *)0x0) {
    if (pAbc->vCexVec == (Vec_Ptr_t *)0x0) {
      Abc_Print(1,"Cex is not defined.\n");
      goto LAB_001fb467;
    }
  }
  else {
    Abc_CexPrintStats(pAbc->pCex);
  }
  if (pAbc->vCexVec != (Vec_Ptr_t *)0x0) {
    putchar(10);
    pVVar3 = pAbc->vCexVec;
    if (pVVar3->nSize < 1) {
      uVar10 = 0;
    }
    else {
      lVar9 = 0;
      uVar10 = 0;
      uVar7 = 0;
      do {
        p = (Abc_Cex_t *)pVVar3->pArray[lVar9];
        if (p != (Abc_Cex_t *)0x0) {
          if (p == (Abc_Cex_t *)0x1) {
            uVar10 = (ulong)((int)uVar10 + 1);
          }
          else {
            uVar7 = (ulong)((int)uVar7 + 1);
            printf("%4d : ",uVar7);
            Abc_CexPrintStats(p);
          }
        }
        lVar9 = lVar9 + 1;
        pVVar3 = pAbc->vCexVec;
      } while (lVar9 < pVVar3->nSize);
    }
    if ((int)uVar10 != 0) {
      printf("In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n",uVar10);
    }
  }
LAB_001fb467:
  pVVar4 = pAbc->vStatuses;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (bVar1) {
      iVar2 = pVVar4->nSize;
      lVar9 = (long)iVar2;
      uVar10 = 0;
      uVar7 = 0;
      if (0 < lVar9) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          uVar7 = (ulong)((int)uVar7 + (uint)(pVVar4->pArray[lVar8] == 0));
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
      }
      if (0 < iVar2) {
        lVar8 = 0;
        uVar10 = 0;
        do {
          uVar10 = (ulong)((int)uVar10 + (uint)(pVVar4->pArray[lVar8] == 1));
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
      }
      if (iVar2 < 1) {
        uVar5 = 0;
      }
      else {
        lVar8 = 0;
        uVar5 = 0;
        do {
          uVar5 = (ulong)((int)uVar5 + (uint)(pVVar4->pArray[lVar8] == -1));
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
      }
      printf("Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",uVar7,
             uVar10,uVar5);
    }
    else {
      pVVar4 = pAbc->vStatuses;
      if (0 < pVVar4->nSize) {
        uVar10 = 0;
        do {
          printf("%d=%d  ",uVar10 & 0xffffffff,(ulong)(uint)pVVar4->pArray[uVar10]);
          uVar10 = uVar10 + 1;
          pVVar4 = pAbc->vStatuses;
        } while ((long)uVar10 < (long)pVVar4->nSize);
      }
    }
    putchar(10);
  }
  return 0;
}

Assistant:

int Abc_CommandPrintStatus( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fShort = 1;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "sh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fShort ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    Abc_Print( 1,"Status = %d  Frames = %d   ", pAbc->Status, pAbc->nFrames );
    if ( pAbc->pCex == NULL && pAbc->vCexVec == NULL )
        Abc_Print( 1,"Cex is not defined.\n" );
    else
    {
        if ( pAbc->pCex )
            Abc_CexPrintStats( pAbc->pCex );
        if ( pAbc->vCexVec )
        {
            Abc_Cex_t * pTemp;
            int nCexes = 0;
            int Counter = 0;
            printf( "\n" );
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                if ( pTemp == (void *)(ABC_PTRINT_T)1 )
                {
                    Counter++;
                    continue;
                }
                if ( pTemp )
                {
                    printf( "%4d : ", ++nCexes );
                    Abc_CexPrintStats( pTemp );
                }
            }
            if ( Counter )
                printf( "In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n", Counter, Vec_PtrSize(pAbc->vCexVec) );
        }
    }
    if ( pAbc->vStatuses )
    {
        if ( fShort )
        {
            printf( "Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).", 
                Vec_IntCountEntry(pAbc->vStatuses, 0), Vec_IntCountEntry(pAbc->vStatuses, 1), 
                Vec_IntCountEntry(pAbc->vStatuses, -1), Vec_IntSize(pAbc->vStatuses) );
        }
        else
        {
            int i, Entry;
            Vec_IntForEachEntry( pAbc->vStatuses, Entry, i )
                printf( "%d=%d  ", i, Entry );
        }
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_status [-sh]\n" );
    Abc_Print( -2, "\t        prints verification status\n" );
    Abc_Print( -2, "\t-s    : toggle using short print-out [default = %s]\n", fShort? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}